

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

short MeCab::tocost(double d,int n)

{
  double *pdVar1;
  int in_EDI;
  double in_XMM0_Qa;
  double local_28;
  double local_20;
  double local_18 [3];
  
  local_18[0] = (double)-in_EDI * in_XMM0_Qa;
  local_20 = 32767.0;
  pdVar1 = std::min<double>(local_18,&local_20);
  local_28 = -32767.0;
  pdVar1 = std::max<double>(pdVar1,&local_28);
  return (short)(int)*pdVar1;
}

Assistant:

inline short int tocost(double d, int n) {
  static const short max = +32767;
  static const short min = -32767;
  return static_cast<short>(std::max<double>(
                                std::min<double>(
                                    -n * d,
                                    static_cast<double>(max)),
                                static_cast<double>(min)) );
}